

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QtFontStyle * bestStyle(QtFontFoundry *foundry,Key *styleKey,QString *styleName)

{
  QtFontStyle *pQVar1;
  uint3 uVar2;
  uint3 uVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = 0;
  uVar9 = 0xffff;
  uVar12 = 0;
  do {
    iVar10 = (int)uVar12;
    if ((long)foundry->count <= (long)uVar11) {
LAB_0042721c:
      QtPrivateLogging::lcFontMatch();
      if (((byte)QtPrivateLogging::lcFontMatch::category.field_2.bools.enabledDebug._q_value._M_base
                 ._M_i & 1) != 0) {
        local_58[0] = '\x02';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_40 = QtPrivateLogging::lcFontMatch::category.name;
        QMessageLogger::debug(local_58,"          best style has distance 0x%x",(ulong)uVar9);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return foundry->styles[iVar10];
    }
    pQVar1 = foundry->styles[uVar11];
    if (((styleName->d).size != 0) && (bVar4 = comparesEqual(styleName,&pQVar1->styleName), bVar4))
    {
      uVar9 = 0;
      iVar10 = (int)uVar11;
      goto LAB_0042721c;
    }
    uVar2 = *(uint3 *)styleKey;
    uVar3 = *(uint3 *)&pQVar1->key;
    uVar5 = (short)((*(ushort *)styleKey >> 2 & 0x3ff) - (*(ushort *)&pQVar1->key >> 2 & 0x3ff)) /
            10;
    uVar7 = -uVar5;
    if (0 < (short)uVar5) {
      uVar7 = uVar5;
    }
    uVar6 = (uint)uVar7;
    if ((0xfff < uVar2) && (0xfff < uVar3)) {
      iVar8 = ((int)((uint)uVar2 << 8) >> 0x14) - ((int)((uint)uVar3 << 8) >> 0x14);
      iVar10 = -iVar8;
      if (0 < iVar8) {
        iVar10 = iVar8;
      }
      uVar6 = (uint)uVar7 + iVar10;
    }
    if ((uVar2 & 3) != (uVar3 & 3)) {
      if (((uVar2 & 3) == 0) || ((uVar3 & 3) == 0)) {
        uVar6 = uVar6 + 0x1000;
      }
      else {
        uVar6 = uVar6 + 1;
      }
    }
    if ((int)uVar6 < (int)uVar9) {
      uVar12 = uVar11 & 0xffffffff;
      uVar9 = uVar6;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static QtFontStyle *bestStyle(QtFontFoundry *foundry, const QtFontStyle::Key &styleKey,
                              const QString &styleName = QString())
{
    int best = 0;
    int dist = 0xffff;

    for ( int i = 0; i < foundry->count; i++ ) {
        QtFontStyle *style = foundry->styles[i];

        if (!styleName.isEmpty() && styleName == style->styleName) {
            dist = 0;
            best = i;
            break;
        }

        int d = qAbs( (int(styleKey.weight) - int(style->key.weight)) / 10 );

        if ( styleKey.stretch != 0 && style->key.stretch != 0 ) {
            d += qAbs( styleKey.stretch - style->key.stretch );
        }

        if (styleKey.style != style->key.style) {
            if (styleKey.style != QFont::StyleNormal && style->key.style != QFont::StyleNormal)
                // one is italic, the other oblique
                d += 0x0001;
            else
                d += 0x1000;
        }

        if ( d < dist ) {
            best = i;
            dist = d;
        }
    }

    qCDebug(lcFontMatch,  "          best style has distance 0x%x", dist );
    return foundry->styles[best];
}